

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sesschan.c
# Opt level: O2

_Bool sesschan_enable_x11_forwarding
                (Channel *chan,_Bool oneshot,ptrlen authproto,ptrlen authdata_hex,uint screen_number
                )

{
  byte bVar1;
  byte bVar2;
  ptrlen authdata;
  uint uVar3;
  strbuf *buf_o;
  ushort **ppuVar4;
  ulong uVar5;
  char *screen_number_suffix;
  ulong uVar6;
  uchar *hex;
  _Bool _Var7;
  char hexbuf [3];
  
  if ((((byte)authdata_hex.len | oneshot) & 1) == 0) {
    buf_o = strbuf_new_nm();
    for (uVar6 = 0; uVar6 < authdata_hex.len; uVar6 = uVar6 + 2) {
      ppuVar4 = __ctype_b_loc();
      bVar1 = *(byte *)((long)authdata_hex.ptr + uVar6);
      if (((*(byte *)((long)*ppuVar4 + (ulong)bVar1 * 2 + 1) & 0x10) == 0) ||
         (bVar2 = *(byte *)((long)authdata_hex.ptr + uVar6 + 1),
         (*(byte *)((long)*ppuVar4 + (ulong)bVar2 * 2 + 1) & 0x10) == 0)) {
        strbuf_free(buf_o);
        goto LAB_00115ac3;
      }
      hexbuf[2] = '\0';
      hexbuf[0] = bVar1;
      hexbuf[1] = bVar2;
      uVar5 = strtoul(hexbuf,(char **)0x0,0x10);
      BinarySink_put_byte(buf_o->binarysink_,(uchar)uVar5);
    }
    chan[-7].vt = (ChannelVtable *)&xfwd_plugvt;
    screen_number_suffix = dupprintf(".%u",(ulong)screen_number);
    authdata.ptr = buf_o->u;
    authdata.len = buf_o->len;
    uVar3 = platform_make_x11_server
                      ((Plug *)(chan + -7),"Uppity",10,screen_number_suffix,authproto,authdata,
                       (Socket **)(chan + -6),(Conf *)chan[-0x5c].vt);
    chan[-7].initial_fixed_window_size = uVar3;
    safefree(screen_number_suffix);
    strbuf_free(buf_o);
    _Var7 = chan[-7].initial_fixed_window_size != 0;
  }
  else {
LAB_00115ac3:
    _Var7 = false;
  }
  return _Var7;
}

Assistant:

bool sesschan_enable_x11_forwarding(
    Channel *chan, bool oneshot, ptrlen authproto, ptrlen authdata_hex,
    unsigned screen_number)
{
    sesschan *sess = container_of(chan, sesschan, chan);
    strbuf *authdata_bin;
    size_t i;

    if (oneshot)
        return false;                  /* not supported */

    /*
     * Decode the authorisation data from ASCII hex into binary.
     */
    if (authdata_hex.len % 2)
        return false;                  /* expected an even number of digits */
    authdata_bin = strbuf_new_nm();
    for (i = 0; i < authdata_hex.len; i += 2) {
        const unsigned char *hex = authdata_hex.ptr;
        char hexbuf[3];

        if (!isxdigit(hex[i]) || !isxdigit(hex[i+1])) {
            strbuf_free(authdata_bin);
            return false;              /* not hex */
        }

        hexbuf[0] = hex[i];
        hexbuf[1] = hex[i+1];
        hexbuf[2] = '\0';
        put_byte(authdata_bin, strtoul(hexbuf, NULL, 16));
    }

    sess->xfwd_plug.vt = &xfwd_plugvt;

    char *screensuffix = dupprintf(".%u", screen_number);

    sess->n_x11_sockets = platform_make_x11_server(
        &sess->xfwd_plug, appname, 10, screensuffix,
        authproto, ptrlen_from_strbuf(authdata_bin),
        sess->x11_sockets, sess->conf);

    sfree(screensuffix);
    strbuf_free(authdata_bin);
    return sess->n_x11_sockets != 0;
}